

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

void __thiscall sing::HttpResponse::makeErrorResponse(HttpResponse *this,string *msg)

{
  string *psVar1;
  mapped_type *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  HttpStatusCode local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  psVar1 = &this->body;
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::to_string(&local_40,this->code);
  std::operator+(&local_60,&local_40," : ");
  local_64 = this->code;
  __rhs = std::
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at(&statusCode2Message_abi_cxx11_,(key_type *)&local_64);
  std::operator+(&local_88,&local_60,__rhs);
  std::operator+(&bStack_a8,&local_88,"\n");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(&local_88,"<p>",msg);
  std::operator+(&bStack_a8,&local_88,"</p>");
  std::__cxx11::string::append((string *)psVar1);
  std::__cxx11::string::~string((string *)&bStack_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_a8,"Content-Type",(allocator<char> *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"text/html",(allocator<char> *)&local_40);
  addHeader(this,&bStack_a8,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&bStack_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_a8,"Content-Length",(allocator<char> *)&local_60);
  std::__cxx11::to_string(&local_88,(this->body)._M_string_length);
  addHeader(this,&bStack_a8,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&bStack_a8);
  return;
}

Assistant:

void HttpResponse::makeErrorResponse(const std::string& msg){//FIX ME: send error page html file
    body += "<html><title>Server Error</title>";
    body += "<body bgcolor=\"ffffff\">";
    body += std::to_string(this->code) + " : " + statusCode2Message.at(code) + "\n";
    body += "<p>" + msg + "</p>";
    body += "<hr><em>sing web server</em></body></html>";
    addHeader("Content-Type", "text/html");
    addHeader("Content-Length", std::to_string(body.size()));
}